

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O1

int __thiscall TokenPipeEnd::TokenWrite(TokenPipeEnd *this,uint8_t token)

{
  ssize_t sVar1;
  int *piVar2;
  int unaff_EBP;
  long in_FS_OFFSET;
  bool bVar3;
  uint8_t local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = token;
  do {
    sVar1 = write(this->m_fd,&local_29,1);
    if (sVar1 < 0) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
      if (!bVar3) {
        unaff_EBP = -1;
      }
    }
    else {
      unaff_EBP = (uint)(sVar1 != 0) * 2 + -2;
      bVar3 = false;
    }
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return unaff_EBP;
  }
  __stack_chk_fail();
}

Assistant:

int TokenPipeEnd::TokenWrite(uint8_t token)
{
    while (true) {
        ssize_t result = write(m_fd, &token, 1);
        if (result < 0) {
            // Failure. It's possible that the write was interrupted by a signal,
            // in that case retry.
            if (errno != EINTR) {
                return TS_ERR;
            }
        } else if (result == 0) {
            return TS_EOS;
        } else { // ==1
            return 0;
        }
    }
}